

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O0

void vera::computeSmoothingNormals
               (attrib_t *_attrib,shape_t *_shape,
               map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
               *smoothVertexNormals)

{
  undefined4 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer ppVar5;
  mapped_type *pmVar6;
  vec3 vVar7;
  vec<3,_float,_(glm::qualifier)0> vVar8;
  undefined8 local_108;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_100;
  _Self local_e8;
  _Base_ptr local_e0;
  _Self local_d8;
  _Base_ptr local_d0;
  ulong local_c8;
  size_t i_1;
  undefined4 uStack_b8;
  vec3 normal;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a8;
  ulong local_90;
  size_t i;
  vec3 v [3];
  int vi [3];
  index_t idx2;
  index_t idx1;
  index_t idx0;
  size_t f;
  iterator iter;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  *smoothVertexNormals_local;
  shape_t *_shape_local;
  attrib_t *_attrib_local;
  
  iter._M_node = (_Base_ptr)smoothVertexNormals;
  std::
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  ::clear(smoothVertexNormals);
  std::_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>::
  _Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)&f);
  idx0.normal_index = 0;
  idx0.texcoord_index = 0;
  while( true ) {
    sVar3 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::size
                      (&(_shape->mesh).indices);
    if (sVar3 / 3 <= (ulong)idx0._4_8_) break;
    pvVar4 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                       (&(_shape->mesh).indices,idx0._4_8_ * 3);
    uVar1 = pvVar4->vertex_index;
    std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
              (&(_shape->mesh).indices,idx0._4_8_ * 3 + 1);
    std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
              (&(_shape->mesh).indices,idx0._4_8_ * 3 + 2);
    v[2].field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)uVar1;
    for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
      vVar7 = getVertex(_attrib,(int)(&v[2].field_2)[local_90]);
      normal._4_8_ = vVar7._0_8_;
      local_a8 = vVar7.field_2;
      v[local_90 - 1].field_1 = normal.field_1;
      v[local_90 - 1].field_2 = normal.field_2;
      *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(v + local_90) = local_a8;
      unique0x10000434 = vVar7;
    }
    calcNormal((vec3 *)&i,(vec3 *)&v[0].field_1,(vec3 *)&v[1].field_1,(vec3 *)((long)&i_1 + 4));
    for (local_c8 = 0; local_c8 < 3; local_c8 = local_c8 + 1) {
      local_d0 = (_Base_ptr)
                 std::
                 map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                 ::find(iter._M_node,(key_type_conflict *)(&v[2].field_2 + local_c8));
      f = (size_t)local_d0;
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
           ::end(iter._M_node);
      bVar2 = std::operator!=((_Self *)&f,&local_d8);
      if (bVar2) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>::
                 operator->((_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)&f);
        glm::vec<3,float,(glm::qualifier)0>::operator+=
                  ((vec<3,float,(glm::qualifier)0> *)&ppVar5->second,
                   (vec<3,_float,_(glm::qualifier)0> *)((long)&i_1 + 4));
      }
      else {
        pmVar6 = std::
                 map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                 ::operator[]((map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                               *)iter._M_node,(key_type_conflict *)(&v[2].field_2 + local_c8));
        pmVar6->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)i_1._4_4_;
        pmVar6->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uStack_b8;
        pmVar6->field_2 =
             (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)normal.field_0;
      }
    }
    idx0._4_8_ = idx0._4_8_ + 1;
  }
  local_e0 = (_Base_ptr)
             std::
             map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
             ::begin(iter._M_node);
  f = (size_t)local_e0;
  while( true ) {
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
         ::end(iter._M_node);
    bVar2 = std::operator!=((_Self *)&f,&local_e8);
    if (!bVar2) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *)&f);
    vVar8 = glm::normalize<3,float,(glm::qualifier)0>(&ppVar5->second);
    local_108 = vVar8._0_8_;
    local_100 = vVar8.field_2;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>::
             operator->((_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *)&f);
    (ppVar5->second).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_108;
    (ppVar5->second).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_108._4_4_;
    (ppVar5->second).field_2 = local_100;
    std::_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_> *)
               &f,0);
  }
  return;
}

Assistant:

void computeSmoothingNormals(const tinyobj::attrib_t& _attrib, const tinyobj::shape_t& _shape, std::map<int, glm::vec3>& smoothVertexNormals) {
    smoothVertexNormals.clear();

    std::map<int, glm::vec3>::iterator iter;

    for (size_t f = 0; f < _shape.mesh.indices.size() / 3; f++) {
        // Get the three indexes of the face (all faces are triangular)
        tinyobj::index_t idx0 = _shape.mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = _shape.mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = _shape.mesh.indices[3 * f + 2];

        // Get the three vertex indexes and coordinates
        int vi[3];      // indexes
        vi[0] = idx0.vertex_index;
        vi[1] = idx1.vertex_index;
        vi[2] = idx2.vertex_index;

        glm::vec3 v[3];  // coordinates
        for (size_t i = 0; i < 3; i++)
            v[i] = getVertex(_attrib, vi[i]);

        // Compute the normal of the face
        glm::vec3 normal;
        calcNormal(v[0], v[1], v[2], normal);

        // Add the normal to the three vertexes
        for (size_t i = 0; i < 3; ++i) {
            iter = smoothVertexNormals.find(vi[i]);
            // add
            if (iter != smoothVertexNormals.end())
                iter->second += normal;
            else
                smoothVertexNormals[vi[i]] = normal;
        }
    }  // f

    // Normalize the normals, that is, make them unit vectors
    for (iter = smoothVertexNormals.begin(); iter != smoothVertexNormals.end(); iter++) {
        iter->second = glm::normalize(iter->second);
    }
}